

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ApiColumnSize(Fts5Context *pCtx,int iCol,int *pnToken)

{
  long lVar1;
  uint uVar2;
  i64 iRowid_00;
  int *in_RDX;
  int in_ESI;
  Fts5Cursor *in_RDI;
  long in_FS_OFFSET;
  int i_2;
  int i_1;
  int i;
  i64 iRowid;
  int rc;
  Fts5Config *pConfig;
  Fts5FullTable *pTab;
  Fts5Cursor *pCsr;
  int n;
  char *z;
  Fts5Cursor *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar3;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined8 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  int iVar4;
  Fts5Config *pConfig_00;
  Fts5Config *pConfig_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pConfig_01 = (Fts5Config *)(in_RDI->base).pVtab;
  pConfig_00 = (Fts5Config *)pConfig_01->zName;
  iVar4 = 0;
  if ((in_RDI->csrflags & 4U) != 0) {
    if (pConfig_00->bColumnsize == 0) {
      if ((pConfig_00->zContent == (char *)0x0) || (pConfig_00->eContent == 3)) {
        for (iVar3 = 0; iVar3 < pConfig_00->nCol; iVar3 = iVar3 + 1) {
          if (pConfig_00->abUnindexed[iVar3] == '\0') {
            in_RDI->aColumnSize[iVar3] = -1;
          }
        }
      }
      else {
        iVar4 = fts5SeekCursor(in_RDI,in_ESI);
        iVar3 = 0;
        while( true ) {
          uVar2 = in_stack_ffffffffffffff98 & 0xffffff;
          if (iVar4 == 0) {
            uVar2 = CONCAT13(iVar3 < pConfig_00->nCol,(int3)in_stack_ffffffffffffff98);
          }
          in_stack_ffffffffffffff98 = uVar2;
          if ((char)(in_stack_ffffffffffffff98 >> 0x18) == '\0') break;
          if (pConfig_00->abUnindexed[iVar3] == '\0') {
            in_RDI->aColumnSize[iVar3] = 0;
            iVar4 = fts5TextFromStmt(pConfig_00,
                                     (sqlite3_stmt *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                                     (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                                     (char **)CONCAT44(in_stack_ffffffffffffffa4,iVar3),
                                     (int *)CONCAT44(in_stack_ffffffffffffff9c,
                                                     in_stack_ffffffffffffff98));
            if (iVar4 == 0) {
              iVar4 = sqlite3Fts5Tokenize(pConfig_01,(int)((ulong)pConfig_00 >> 0x20),
                                          (char *)(ulong)in_stack_ffffffffffffffb0,
                                          (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                                          (void *)CONCAT44(in_stack_ffffffffffffffa4,iVar3),
                                          (_func_int_void_ptr_int_char_ptr_int_int_int *)
                                          CONCAT44(in_stack_ffffffffffffff9c,
                                                   in_stack_ffffffffffffff98));
            }
            sqlite3Fts5ClearLocale((Fts5Config *)0x283cb5);
          }
          iVar3 = iVar3 + 1;
        }
      }
    }
    else {
      iRowid_00 = fts5CursorRowid(in_stack_ffffffffffffff88);
      iVar4 = sqlite3Fts5StorageDocsize
                        ((Fts5Storage *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),iRowid_00,
                         (int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    }
    in_RDI->csrflags = in_RDI->csrflags & 0xfffffffb;
  }
  if (in_ESI < 0) {
    *in_RDX = 0;
    for (iVar3 = 0; iVar3 < pConfig_00->nCol; iVar3 = iVar3 + 1) {
      *in_RDX = in_RDI->aColumnSize[iVar3] + *in_RDX;
    }
  }
  else if (in_ESI < pConfig_00->nCol) {
    *in_RDX = in_RDI->aColumnSize[in_ESI];
  }
  else {
    *in_RDX = 0;
    iVar4 = 0x19;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

static int fts5ApiColumnSize(Fts5Context *pCtx, int iCol, int *pnToken){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5FullTable *pTab = (Fts5FullTable*)(pCsr->base.pVtab);
  Fts5Config *pConfig = pTab->p.pConfig;
  int rc = SQLITE_OK;

  if( CsrFlagTest(pCsr, FTS5CSR_REQUIRE_DOCSIZE) ){
    if( pConfig->bColumnsize ){
      i64 iRowid = fts5CursorRowid(pCsr);
      rc = sqlite3Fts5StorageDocsize(pTab->pStorage, iRowid, pCsr->aColumnSize);
    }else if( !pConfig->zContent || pConfig->eContent==FTS5_CONTENT_UNINDEXED ){
      int i;
      for(i=0; i<pConfig->nCol; i++){
        if( pConfig->abUnindexed[i]==0 ){
          pCsr->aColumnSize[i] = -1;
        }
      }
    }else{
      int i;
      rc = fts5SeekCursor(pCsr, 0);
      for(i=0; rc==SQLITE_OK && i<pConfig->nCol; i++){
        if( pConfig->abUnindexed[i]==0 ){
          const char *z = 0;
          int n = 0;
          pCsr->aColumnSize[i] = 0;
          rc = fts5TextFromStmt(pConfig, pCsr->pStmt, i, &z, &n);
          if( rc==SQLITE_OK ){
            rc = sqlite3Fts5Tokenize(pConfig, FTS5_TOKENIZE_AUX,
                z, n, (void*)&pCsr->aColumnSize[i], fts5ColumnSizeCb
            );
          }
          sqlite3Fts5ClearLocale(pConfig);
        }
      }
    }
    CsrFlagClear(pCsr, FTS5CSR_REQUIRE_DOCSIZE);
  }
  if( iCol<0 ){
    int i;
    *pnToken = 0;
    for(i=0; i<pConfig->nCol; i++){
      *pnToken += pCsr->aColumnSize[i];
    }
  }else if( iCol<pConfig->nCol ){
    *pnToken = pCsr->aColumnSize[iCol];
  }else{
    *pnToken = 0;
    rc = SQLITE_RANGE;
  }
  return rc;
}